

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * __thiscall
fmt::v6::internal::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  size_t __len;
  char *pcVar7;
  byte *__s;
  byte *pbVar8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  size_t sVar13;
  ptrdiff_t _Num;
  ulong __n;
  bool bVar14;
  
  iVar1 = this->num_digits_;
  uVar10 = this->exp_ + iVar1;
  if ((this->specs_).field_0x4 == '\x01') {
    *it = *this->digits_;
    iVar1 = this->num_digits_;
    iVar4 = (this->specs_).precision;
    if ((iVar1 < 2) && (((this->specs_).field_0x6 & 0x20) == 0)) {
      pcVar7 = it + 1;
      iVar6 = iVar1;
    }
    else {
      it[1] = this->decimal_point_;
      pcVar7 = it + 2;
      iVar6 = this->num_digits_;
    }
    uVar12 = iVar4 - iVar1;
    if (iVar6 != 1) {
      memmove(pcVar7,this->digits_ + 1,(long)iVar6 - 1U);
    }
    __s = (byte *)(pcVar7 + ((long)iVar6 - 1U));
    uVar11 = *(uint *)&(this->specs_).field_0x4;
    pbVar8 = __s;
    if ((uVar11 >> 0x15 & 1) != 0 && 0 < (int)uVar12) {
      pbVar8 = __s + uVar12;
      memset(__s,0x30,(ulong)uVar12);
      uVar11 = *(uint *)&(this->specs_).field_0x4;
    }
    *pbVar8 = ((uVar11 >> 0x10 & 1) == 0) << 5 | 0x45;
    pcVar7 = write_exponent<char,char*>(uVar10 - 1,(char *)(pbVar8 + 1));
    return pcVar7;
  }
  if (-1 < this->exp_) {
    if (iVar1 == 0) {
      iVar4 = 0;
    }
    else {
      memmove(it,this->digits_,(long)iVar1);
      iVar4 = this->num_digits_;
    }
    pcVar9 = it + iVar1;
    uVar12 = uVar10 - iVar4;
    pcVar7 = pcVar9;
    if (uVar12 != 0 && iVar4 <= (int)uVar10) {
      pcVar7 = pcVar9 + uVar12;
      memset(pcVar9,0x30,(ulong)uVar12);
    }
    if ((((this->specs_).field_0x6 & 0x20) == 0) && (-1 < (this->specs_).precision)) {
      return pcVar7;
    }
    pcVar9 = pcVar7 + 1;
    *pcVar7 = this->decimal_point_;
    iVar1 = (this->specs_).precision;
    uVar12 = iVar1 - uVar10;
    if (uVar12 != 0 && (int)uVar10 <= iVar1) {
      memset(pcVar9,0x30,(ulong)uVar12);
      return pcVar9 + uVar12;
    }
    if ((this->specs_).field_0x4 == '\x02') {
      return pcVar9;
    }
    pcVar7[1] = '0';
    return pcVar7 + 2;
  }
  if (0 < (int)uVar10) {
    __n = (ulong)uVar10;
    memmove(it,this->digits_,__n);
    pcVar7 = it + __n;
    if (((this->specs_).field_0x6 & 0x20) != 0) {
      *pcVar7 = this->decimal_point_;
      sVar13 = (long)this->num_digits_ - __n;
      if (this->num_digits_ != uVar10) {
        memmove(pcVar7 + 1,this->digits_ + __n,sVar13);
        uVar10 = this->num_digits_;
      }
      pcVar7 = pcVar7 + 1 + sVar13;
      iVar1 = (this->specs_).precision;
      uVar12 = iVar1 - uVar10;
      if (uVar12 == 0 || iVar1 < (int)uVar10) {
        return pcVar7;
      }
      if (uVar12 == 0 || iVar1 < (int)uVar10) {
        return pcVar7;
      }
      memset(pcVar7,0x30,(ulong)uVar12);
      return pcVar7 + uVar12;
    }
    uVar5 = (ulong)(uint)this->num_digits_;
    if ((int)uVar10 < this->num_digits_) {
      do {
        if (this->digits_[uVar5 - 1] != '0') goto LAB_0012ca65;
        uVar5 = uVar5 - 1;
      } while ((long)__n < (long)uVar5);
    }
    else {
LAB_0012ca65:
      uVar12 = (uint)uVar5;
      bVar14 = uVar12 != uVar10;
      uVar10 = uVar12;
      if (bVar14) {
        *pcVar7 = this->decimal_point_;
        pcVar7 = pcVar7 + 1;
        sVar13 = (long)(int)uVar12 - __n;
        memmove(pcVar7,this->digits_ + __n,sVar13);
        goto LAB_0012cb10;
      }
    }
    sVar13 = (long)(int)uVar10 - __n;
LAB_0012cb10:
    return pcVar7 + sVar13;
  }
  *it = '0';
  uVar11 = -uVar10;
  uVar12 = this->num_digits_;
  if (uVar12 == 0) {
    uVar12 = (this->specs_).precision;
    uVar3 = uVar11;
    if (SBORROW4(uVar12,uVar11) != (int)(uVar12 + uVar10) < 0) {
      uVar3 = uVar12;
    }
    if (-1 < (int)uVar12) {
      uVar11 = uVar3;
    }
    bVar14 = ((this->specs_).field_0x6 & 0x20) == 0;
  }
  else {
    uVar10 = *(uint *)&(this->specs_).field_0x4 & 0x200000;
    bVar14 = uVar10 == 0;
    if ((int)uVar12 < 1 || (char)(uVar10 >> 0x15) != '\0') goto LAB_0012ca93;
    bVar14 = true;
    do {
      if (this->digits_[(ulong)uVar12 - 1] != '0') goto LAB_0012ca93;
      bVar2 = 1 < (int)uVar12;
      uVar12 = uVar12 - 1;
    } while (bVar2);
  }
  uVar12 = 0;
LAB_0012ca93:
  if ((uVar12 == 0 && uVar11 == 0) && (bVar14)) {
    pcVar7 = it + 1;
  }
  else {
    it[1] = this->decimal_point_;
    pcVar9 = it + 2;
    pcVar7 = pcVar9;
    if (0 < (int)uVar11) {
      pcVar7 = pcVar9 + uVar11;
      memset(pcVar9,0x30,(ulong)uVar11);
    }
    if (uVar12 != 0) {
      memmove(pcVar7,this->digits_,(long)(int)uVar12);
    }
    pcVar7 = pcVar7 + (int)uVar12;
  }
  return pcVar7;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }